

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * __thiscall
lest::to_string<std::__cxx11::string,char[2]>
          (string *__return_storage_ptr__,lest *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,string *op,
          char (*rhs) [2])

{
  ostream *poVar1;
  char **txt;
  ostringstream os;
  string local_1e0;
  string local_1c0;
  string *local_1a0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string(&local_1e0,(string *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(lhs->_M_dataplus)._M_p,lhs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  local_1a0 = op;
  to_string_abi_cxx11_(&local_1c0,(lest *)&local_1a0,txt);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1e0.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1e0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1e0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1e0.field_2._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = local_1e0._M_string_length;
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}